

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

bool __thiscall SplineSolver<5U,_2U>::build_solver(SplineSolver<5U,_2U> *this,int N,int M)

{
  SparseMatrix<double,_0,_int> *dst;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_00;
  ulong col;
  ComputationInfo CVar1;
  Index IVar2;
  Index IVar3;
  StorageIndex *pSVar4;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  StorageIndex *pSVar7;
  Index IVar8;
  Index IVar9;
  SplineSolver<5U,_2U> *pSVar10;
  ulong uVar11;
  Scalar *pSVar12;
  size_t __n;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong row;
  ActualDstType actualDst;
  SparseMatrix<double,_0,_int> local_88;
  SplineSolver<5U,_2U> *local_40;
  ulong local_38;
  
  lVar15 = (long)M;
  local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
  local_88.m_outerSize = 0;
  local_88.m_innerSize = 0;
  local_88.m_outerIndex = (StorageIndex *)0x0;
  local_88.m_innerNonZeros = (StorageIndex *)0x0;
  local_88.m_data.m_values = (Scalar *)0x0;
  local_88.m_data.m_indices = (StorageIndex *)0x0;
  local_88.m_data.m_size = 0;
  local_88.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_88,lVar15,lVar15);
  dst = &this->A;
  if (local_88.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    IVar2 = (this->A).m_outerSize;
    IVar3 = (this->A).m_innerSize;
    (this->A).m_outerSize = local_88.m_outerSize;
    (this->A).m_innerSize = local_88.m_innerSize;
    pSVar4 = (this->A).m_outerIndex;
    pSVar5 = (this->A).m_innerNonZeros;
    (this->A).m_outerIndex = local_88.m_outerIndex;
    (this->A).m_innerNonZeros = local_88.m_innerNonZeros;
    pSVar6 = (this->A).m_data.m_values;
    pSVar7 = (this->A).m_data.m_indices;
    (this->A).m_data.m_values = local_88.m_data.m_values;
    (this->A).m_data.m_indices = local_88.m_data.m_indices;
    IVar8 = (this->A).m_data.m_size;
    IVar9 = (this->A).m_data.m_allocatedSize;
    (this->A).m_data.m_size = local_88.m_data.m_size;
    (this->A).m_data.m_allocatedSize = local_88.m_data.m_allocatedSize;
    local_88.m_outerSize = IVar2;
    local_88.m_innerSize = IVar3;
    local_88.m_outerIndex = pSVar4;
    local_88.m_innerNonZeros = pSVar5;
    local_88.m_data.m_values = pSVar6;
    local_88.m_data.m_indices = pSVar7;
    local_88.m_data.m_size = IVar8;
    local_88.m_data.m_allocatedSize = IVar9;
  }
  else if (dst != &local_88) {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)dst,&local_88);
    if (local_88.m_innerNonZeros == (StorageIndex *)0x0) {
      __n = (this->A).m_outerSize * 4 + 4;
      if (__n != 0) {
        memcpy((this->A).m_outerIndex,local_88.m_outerIndex,__n);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=(&(this->A).m_data,&local_88.m_data)
      ;
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (dst,&local_88);
    }
  }
  local_40 = this;
  free(local_88.m_outerIndex);
  free(local_88.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_88.m_data);
  local_88.m_outerSize = CONCAT44(6,(undefined4)local_88.m_outerSize);
  local_88._0_8_ = lVar15;
  if (M < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  Eigen::SparseMatrix<double,0,int>::
  reserveInnerVectors<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((SparseMatrix<double,0,int> *)dst,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
              *)&local_88);
  if (2 < N) {
    uVar11 = (ulong)(N - 2);
    uVar13 = (ulong)(N - 3);
    row = 0;
    local_38 = uVar13;
    do {
      pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,row);
      *pSVar12 = 16.0;
      lVar15 = uVar11 + row;
      pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,lVar15,row);
      *pSVar12 = 0.0;
      pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,lVar15);
      *pSVar12 = 0.0;
      pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,lVar15,lVar15);
      *pSVar12 = -6.0;
      if (row != 0) {
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,row - 1);
        *pSVar12 = 7.0;
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,lVar15,row - 1);
        *pSVar12 = 8.0;
        lVar14 = row + uVar11 + -1;
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,lVar14);
        *pSVar12 = 1.0;
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,lVar15,lVar14);
        *pSVar12 = 1.0;
      }
      col = row + 1;
      if (row < uVar13) {
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,col);
        *pSVar12 = 7.0;
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,lVar15,col);
        *pSVar12 = -8.0;
        lVar14 = uVar11 + row + 1;
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,lVar14);
        uVar13 = local_38;
        *pSVar12 = -1.0;
        pSVar12 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,lVar15,lVar14);
        *pSVar12 = 1.0;
      }
      row = col;
    } while (uVar11 != col);
  }
  Eigen::SparseMatrix<double,_0,_int>::makeCompressed(dst);
  pSVar10 = local_40;
  this_00 = &local_40->solver;
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            (this_00,dst);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            (this_00,dst);
  if ((pSVar10->solver).
      super_SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>_>
      .m_isInitialized != false) {
    CVar1 = (pSVar10->solver).m_info;
    if (CVar1 != Success) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inverse failed",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    return CVar1 == Success;
  }
  __assert_fail("m_isInitialized && \"Decomposition is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/SparseLU/SparseLU.h",0x12d,
                "ComputationInfo Eigen::SparseLU<Eigen::SparseMatrix<double>, Eigen::COLAMDOrdering<int>>::info() const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
               );
}

Assistant:

bool SplineSolver<5, Dims>::build_solver(const int N, const int M)
{
    A = SparseMatrix<double>(M, M);
    A.reserve(VectorXi::Constant(M, 6));

    for (int k = 0; k<N-2; ++k)
    {
        A.insert(k, k) = 16;
        A.insert(N-2+k, k) = 0;
        A.insert(k, N-2+k) = 0;
        A.insert(N-2+k, N-2+k) = -6;

        if (k > 0)
        {
            A.insert(k, k-1) = 7;
            A.insert(N-2+k, k-1) = 8;
            A.insert(k, N-2+k-1) = 1;
            A.insert(N-2+k, N-2+k-1) = 1;
        }

        if (k < N-3)
        {
            A.insert(k, k+1) = 7;
            A.insert(N-2+k, k+1) = -8;
            A.insert(k, N-2+k+1) = -1;
            A.insert(N-2+k, N-2+k+1) = 1;
        }
    }

    A.makeCompressed();
    solver.compute(A);

    if (solver.info() != Success)
    {
        cout << "inverse failed" << endl;
        return false;
    }

    return true;
}